

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

void Lms_GiaProfilesPrint(Gia_Man_t *p)

{
  char cVar1;
  int iVar2;
  Vec_Wrd_t *p_00;
  Vec_Str_t *p_01;
  Gia_Obj_t *pGVar3;
  word D;
  bool bVar4;
  Vec_Str_t *vAreas;
  Vec_Wrd_t *vDelays;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  p_00 = Lms_GiaDelays(p);
  p_01 = Lms_GiaAreas(p);
  vDelays._4_4_ = 0;
  while( true ) {
    iVar2 = Gia_ManPoNum(p);
    bVar4 = false;
    if ((int)vDelays._4_4_ < iVar2) {
      pGVar3 = Gia_ManCo(p,vDelays._4_4_);
      bVar4 = pGVar3 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    printf("%6d : ",(ulong)vDelays._4_4_);
    cVar1 = Vec_StrEntry(p_01,vDelays._4_4_);
    printf("A = %2d  ",(ulong)(uint)(int)cVar1);
    D = Vec_WrdEntry(p_00,vDelays._4_4_);
    iVar2 = Gia_ManPiNum(p);
    Lms_DelayPrint(D,iVar2);
    vDelays._4_4_ = vDelays._4_4_ + 1;
  }
  Vec_WrdFree(p_00);
  Vec_StrFree(p_01);
  return;
}

Assistant:

void Lms_GiaProfilesPrint( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_Wrd_t * vDelays;
    Vec_Str_t * vAreas;
    vDelays = Lms_GiaDelays( p );
    vAreas = Lms_GiaAreas( p );
    Gia_ManForEachPo( p, pObj, i )
    {
        printf( "%6d : ", i );
        printf( "A = %2d  ", Vec_StrEntry(vAreas, i) );
        Lms_DelayPrint( Vec_WrdEntry(vDelays, i), Gia_ManPiNum(p) );
//        Lms_GiaPrintSubgraph( p, pObj );
//        printf( "\n" );
    }
    Vec_WrdFree( vDelays );
    Vec_StrFree( vAreas );
}